

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

uint setup_center_error(MACROBLOCKD *xd,MV *bestmv,SUBPEL_SEARCH_VAR_PARAMS *var_params,
                       MV_COST_PARAMS *mv_cost_params,uint *sse1,int *distortion)

{
  int iVar1;
  long *in_RDX;
  MV *in_RSI;
  MACROBLOCKD *in_RDI;
  undefined8 in_R8;
  int *in_R9;
  uint8_t comp_pred_1 [16384];
  uint8_t *comp_pred;
  uint16_t comp_pred16 [16384];
  uint besterr;
  int invert_mask;
  int mask_stride;
  uint8_t *mask;
  uint8_t *second_pred;
  int y_stride;
  int src_stride;
  uint8_t *y;
  uint8_t *src;
  MSBuffers *ms_buffers;
  int h;
  int w;
  aom_variance_fn_ptr_t *vfp;
  MV *in_stack_ffffffffffff3f48;
  uint8_t local_c098 [16392];
  uint8_t *local_8090;
  undefined1 local_8088 [32772];
  int local_84;
  int local_80;
  int local_7c;
  MV *local_78;
  uint8_t *local_70;
  int local_68;
  undefined4 local_64;
  uint8_t *local_60;
  undefined8 local_58;
  long *local_50;
  int local_48;
  int local_44;
  long local_40;
  int *local_38;
  undefined8 local_30;
  MACROBLOCKD *local_10;
  
  local_40 = *in_RDX;
  local_44 = (int)in_RDX[9];
  local_48 = *(int *)((long)in_RDX + 0x4c);
  local_50 = in_RDX + 2;
  local_58 = *(undefined8 *)in_RDX[3];
  local_38 = in_R9;
  local_30 = in_R8;
  local_10 = in_RDI;
  local_60 = get_buf_from_mv((buf_2d *)*local_50,*in_RSI);
  local_64 = *(undefined4 *)(local_50[1] + 0x18);
  local_68 = *(int *)(*local_50 + 0x18);
  local_70 = (uint8_t *)local_50[2];
  local_78 = (MV *)local_50[3];
  local_7c = (int)local_50[4];
  local_80 = *(int *)((long)local_50 + 0x24);
  if (local_70 == (uint8_t *)0x0) {
    local_84 = (**(code **)(local_40 + 0x18))(local_60,local_68,local_58,local_64,local_30);
  }
  else {
    iVar1 = is_cur_buf_hbd(local_10);
    if (iVar1 == 0) {
      if (local_78 == (MV *)0x0) {
        (*aom_comp_avg_pred)(local_c098,local_70,local_44,local_48,local_60,local_68);
      }
      else {
        in_stack_ffffffffffff3f48 = local_78;
        (*aom_comp_mask_pred)
                  (local_c098,local_70,local_44,local_48,local_60,local_68,(uint8_t *)local_78,
                   local_7c,local_80);
      }
      local_84 = (**(code **)(local_40 + 0x18))(local_c098,local_44,local_58,local_64,local_30);
    }
    else {
      local_8090 = (uint8_t *)((ulong)local_8088 >> 1);
      if (local_78 == (MV *)0x0) {
        aom_highbd_comp_avg_pred_c(local_8090,local_70,local_44,local_48,local_60,local_68);
      }
      else {
        in_stack_ffffffffffff3f48 = local_78;
        (*aom_highbd_comp_mask_pred)
                  (local_8090,local_70,local_44,local_48,local_60,local_68,(uint8_t *)local_78,
                   local_7c,local_80);
      }
      local_84 = (**(code **)(local_40 + 0x18))(local_8090,local_44,local_58,local_64,local_30);
    }
  }
  *local_38 = local_84;
  iVar1 = mv_err_cost_(in_stack_ffffffffffff3f48,(MV_COST_PARAMS *)0x275937);
  return iVar1 + local_84;
}

Assistant:

static unsigned int setup_center_error(
    const MACROBLOCKD *xd, const MV *bestmv,
    const SUBPEL_SEARCH_VAR_PARAMS *var_params,
    const MV_COST_PARAMS *mv_cost_params, unsigned int *sse1, int *distortion) {
  const aom_variance_fn_ptr_t *vfp = var_params->vfp;
  const int w = var_params->w;
  const int h = var_params->h;

  const MSBuffers *ms_buffers = &var_params->ms_buffers;
  const uint8_t *src = ms_buffers->src->buf;
  const uint8_t *y = get_buf_from_mv(ms_buffers->ref, *bestmv);
  const int src_stride = ms_buffers->src->stride;
  const int y_stride = ms_buffers->ref->stride;
  const uint8_t *second_pred = ms_buffers->second_pred;
  const uint8_t *mask = ms_buffers->mask;
  const int mask_stride = ms_buffers->mask_stride;
  const int invert_mask = ms_buffers->inv_mask;

  unsigned int besterr;

  if (second_pred != NULL) {
#if CONFIG_AV1_HIGHBITDEPTH
    if (is_cur_buf_hbd(xd)) {
      DECLARE_ALIGNED(16, uint16_t, comp_pred16[MAX_SB_SQUARE]);
      uint8_t *comp_pred = CONVERT_TO_BYTEPTR(comp_pred16);
      if (mask) {
        aom_highbd_comp_mask_pred(comp_pred, second_pred, w, h, y, y_stride,
                                  mask, mask_stride, invert_mask);
      } else {
        aom_highbd_comp_avg_pred(comp_pred, second_pred, w, h, y, y_stride);
      }
      besterr = vfp->vf(comp_pred, w, src, src_stride, sse1);
    } else {
      DECLARE_ALIGNED(16, uint8_t, comp_pred[MAX_SB_SQUARE]);
      if (mask) {
        aom_comp_mask_pred(comp_pred, second_pred, w, h, y, y_stride, mask,
                           mask_stride, invert_mask);
      } else {
        aom_comp_avg_pred(comp_pred, second_pred, w, h, y, y_stride);
      }
      besterr = vfp->vf(comp_pred, w, src, src_stride, sse1);
    }
#else
    (void)xd;
    DECLARE_ALIGNED(16, uint8_t, comp_pred[MAX_SB_SQUARE]);
    if (mask) {
      aom_comp_mask_pred(comp_pred, second_pred, w, h, y, y_stride, mask,
                         mask_stride, invert_mask);
    } else {
      aom_comp_avg_pred(comp_pred, second_pred, w, h, y, y_stride);
    }
    besterr = vfp->vf(comp_pred, w, src, src_stride, sse1);
#endif
  } else {
    besterr = vfp->vf(y, y_stride, src, src_stride, sse1);
  }
  *distortion = besterr;
  besterr += mv_err_cost_(bestmv, mv_cost_params);
  return besterr;
}